

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

ImGuiTableSettings * ImGui::TableSettingsFindByID(ImGuiID id)

{
  ImGuiTableSettings *pIVar1;
  ImGuiTableSettings *pIVar2;
  ImGuiTableSettings *pIVar3;
  
  pIVar1 = (ImGuiTableSettings *)(GImGui->SettingsTables).Buf.Data;
  pIVar2 = (ImGuiTableSettings *)&pIVar1->SaveFlags;
  pIVar3 = pIVar1;
  if (pIVar1 != (ImGuiTableSettings *)0x0) {
    while (pIVar3 = pIVar2, pIVar2->ID != id) {
      pIVar2 = (ImGuiTableSettings *)((long)&pIVar2->ID + (long)*(int *)&pIVar2[-1].WantApply);
      if (pIVar2 == (ImGuiTableSettings *)
                    ((long)&pIVar1->SaveFlags + (long)(GImGui->SettingsTables).Buf.Size)) {
        return (ImGuiTableSettings *)0x0;
      }
    }
  }
  return pIVar3;
}

Assistant:

ImGuiTableSettings* ImGui::TableSettingsFindByID(ImGuiID id)
{
    // FIXME-OPT: Might want to store a lookup map for this?
    ImGuiContext& g = *GImGui;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID == id)
            return settings;
    return NULL;
}